

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall google::protobuf::Descriptor::CopyHeadingTo(Descriptor *this,DescriptorProto *proto)

{
  ushort *puVar1;
  FeatureSet *from;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ReservedRange>_>
  *pVVar2;
  ReservedRange *pRVar3;
  MessageOptions *this_00;
  MessageOptions *pMVar4;
  FeatureSet *this_01;
  Arena *arena;
  int i;
  int index;
  int i_1;
  long lVar5;
  string_view value;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  puVar1 = (ushort *)(this->all_names_).payload_;
  value._M_len = (ulong)*puVar1;
  (proto->field_0)._impl_._has_bits_.has_bits_[0] =
       (proto->field_0)._impl_._has_bits_.has_bits_[0] | 1;
  value._M_str = (char *)((long)puVar1 + ~value._M_len);
  arena = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set(&(proto->field_0)._impl_.name_,value,arena);
  for (index = 0; index < this->reserved_range_count_; index = index + 1) {
    pVVar2 = internal::RepeatedPtrFieldBase::
             Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ReservedRange>>
                       (&(proto->field_0)._impl_.reserved_range_.super_RepeatedPtrFieldBase);
    pRVar3 = reserved_range(this,index);
    (pVVar2->field_0)._impl_.start_ = pRVar3->start;
    *(byte *)&pVVar2->field_0 = *(byte *)&pVVar2->field_0 | 1;
    pRVar3 = reserved_range(this,index);
    (pVVar2->field_0)._impl_.end_ = pRVar3->end;
    *(byte *)&pVVar2->field_0 = *(byte *)&pVVar2->field_0 | 2;
  }
  for (lVar5 = 0; lVar5 < this->reserved_name_count_; lVar5 = lVar5 + 1) {
    local_40._M_str = (this->reserved_names_[lVar5]->_M_dataplus)._M_p;
    local_40._M_len = this->reserved_names_[lVar5]->_M_string_length;
    internal::AddToRepeatedPtrField<std::basic_string_view<char,std::char_traits<char>>>
              (&(proto->field_0)._impl_.reserved_name_,&local_40);
  }
  pMVar4 = this->options_;
  if (pMVar4 != (MessageOptions *)_MessageOptions_default_instance_) {
    this_00 = DescriptorProto::mutable_options(proto);
    MessageOptions::CopyFrom(this_00,pMVar4);
  }
  if ((this->field_0x2 & 3) != 0) {
    DescriptorProto::set_visibility
              (proto,(byte)this->field_0x2 & (VISIBILITY_EXPORT|VISIBILITY_LOCAL));
  }
  from = this->proto_features_;
  if (from != (FeatureSet *)_FeatureSet_default_instance_) {
    pMVar4 = DescriptorProto::mutable_options(proto);
    this_01 = MessageOptions::mutable_features(pMVar4);
    FeatureSet::CopyFrom(this_01,from);
  }
  return;
}

Assistant:

void Descriptor::CopyHeadingTo(DescriptorProto* proto) const {
  proto->set_name(name());

  for (int i = 0; i < reserved_range_count(); i++) {
    DescriptorProto::ReservedRange* range = proto->add_reserved_range();
    range->set_start(reserved_range(i)->start);
    range->set_end(reserved_range(i)->end);
  }
  for (int i = 0; i < reserved_name_count(); i++) {
    proto->add_reserved_name(reserved_name(i));
  }

  if (&options() != &MessageOptions::default_instance()) {
    *proto->mutable_options() = options();
  }

  if (visibility_keyword() != SymbolVisibility::VISIBILITY_UNSET) {
    proto->set_visibility(visibility_keyword());
  }

  RestoreFeaturesToOptions(proto_features_, proto);
}